

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void obx::anon_unknown_3::cCallbackTrampolineAsyncTreeGet
               (obx_err status,obx_id id,char *path,void *leaf_data,size_t leaf_data_size,
               void *leaf_metadata,size_t leaf_metadata_size,void *userData)

{
  type this;
  allocator local_e1;
  undefined1 local_e0 [8];
  AsyncTreeGetResult result;
  string local_60 [8];
  string errorMessage;
  unique_ptr<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
  local_40;
  unique_ptr<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
  callback;
  void *leaf_metadata_local;
  size_t leaf_data_size_local;
  void *leaf_data_local;
  char *path_local;
  obx_id id_local;
  obx_err status_local;
  
  callback._M_t.
  super___uniq_ptr_impl<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::function<void_(const_obx::AsyncTreeGetResult_&)>_*,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
  .super__Head_base<0UL,_std::function<void_(const_obx::AsyncTreeGetResult_&)>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>,_true,_true>
                  )(__uniq_ptr_data<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>,_true,_true>
                    )leaf_metadata;
  if (userData != (void *)0x0) {
    std::
    unique_ptr<std::function<void(obx::AsyncTreeGetResult_const&)>,std::default_delete<std::function<void(obx::AsyncTreeGetResult_const&)>>>
    ::unique_ptr<std::default_delete<std::function<void(obx::AsyncTreeGetResult_const&)>>,void>
              ((unique_ptr<std::function<void(obx::AsyncTreeGetResult_const&)>,std::default_delete<std::function<void(obx::AsyncTreeGetResult_const&)>>>
                *)&local_40,(pointer)userData);
    std::__cxx11::string::string(local_60);
    if (status != 0) {
      internal::appendLastErrorText(status,(string *)local_60);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_e0,path,&local_e1);
    result.leaf_data.size =
         (size_t)callback._M_t.
                 super___uniq_ptr_impl<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::function<void_(const_obx::AsyncTreeGetResult_&)>_*,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
                 .
                 super__Head_base<0UL,_std::function<void_(const_obx::AsyncTreeGetResult_&)>_*,_false>
                 ._M_head_impl;
    result.leaf_metadata.data = (void *)leaf_metadata_size;
    result._24_4_ = status;
    result._32_8_ = id;
    result.id = (obx_id)leaf_data;
    result.leaf_data.data = (void *)leaf_data_size;
    std::__cxx11::string::string((string *)&result.leaf_metadata.size,local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    this = std::
           unique_ptr<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
           ::operator*(&local_40);
    std::function<void_(const_obx::AsyncTreeGetResult_&)>::operator()
              (this,(AsyncTreeGetResult *)local_e0);
    AsyncTreeGetResult::~AsyncTreeGetResult((AsyncTreeGetResult *)local_e0);
    std::__cxx11::string::~string(local_60);
    std::
    unique_ptr<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
    ::~unique_ptr(&local_40);
    return;
  }
  __assert_fail("userData",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O0/_deps/objectbox-download-src/include/objectbox.hpp"
                ,0xd6c,
                "void obx::(anonymous namespace)::cCallbackTrampolineAsyncTreeGet(obx_err, obx_id, const char *, const void *, size_t, const void *, size_t, void *)"
               );
}

Assistant:

void cCallbackTrampolineAsyncTreeGet(obx_err status, obx_id id, const char* path, const void* leaf_data,
                                     size_t leaf_data_size, const void* leaf_metadata, size_t leaf_metadata_size,
                                     void* userData) {
    assert(userData);
    std::unique_ptr<AsyncTreeGetCallback> callback(static_cast<AsyncTreeGetCallback*>(userData));
    std::string errorMessage;
    if (status != OBX_SUCCESS) internal::appendLastErrorText(status, errorMessage);
    AsyncTreeGetResult result{
        path, status, id, {leaf_data, leaf_data_size}, {leaf_metadata, leaf_metadata_size}, std::move(errorMessage)};
    (*callback)(result);
}